

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O1

bool google::protobuf::
     InsertIfNotPresent<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
               (hash_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                *collection,first_type *key,second_type *value)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  __buckets_ptr pp_Var4;
  __node_ptr p_Var5;
  _Hash_node_base *p_Var6;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var7;
  long lVar8;
  ulong uVar9;
  size_type __n;
  ulong uVar10;
  char cVar11;
  _Hash_node_base _Var12;
  pointer __ptr_1;
  _Hash_node_base *p_Var13;
  undefined1 auVar14 [16];
  __buckets_alloc_type __alloc;
  new_allocator<std::__detail::_Hash_node_base_*> local_49;
  key_type local_48;
  second_type local_38;
  
  local_48.first = key->first;
  local_48.second = key->second;
  local_38 = *value;
  cVar11 = *(char *)&((_Hash_node_base *)local_48.second)->_M_nxt;
  if (cVar11 == '\0') {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    p_Var13 = (_Hash_node_base *)local_48.second;
    do {
      p_Var13 = (_Hash_node_base *)((long)&p_Var13->_M_nxt + 1);
      lVar8 = (long)cVar11 + lVar8 * 5;
      cVar11 = *(char *)&p_Var13->_M_nxt;
    } while (cVar11 != '\0');
  }
  p_Var13 = (_Hash_node_base *)((long)local_48.first * 0xffff + lVar8);
  uVar9 = (ulong)p_Var13 %
          (collection->
          super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
          )._M_h._M_bucket_count;
  p_Var5 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)collection,uVar9,&local_48,(__hash_code)p_Var13);
  if (p_Var5 == (__node_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)operator_new(0x28);
    p_Var6->_M_nxt = (_Hash_node_base *)0x0;
    p_Var6[1]._M_nxt = (_Hash_node_base *)local_48.first;
    p_Var6[2]._M_nxt = (_Hash_node_base *)local_48.second;
    p_Var6[3]._M_nxt = (_Hash_node_base *)local_38;
    auVar14 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(collection->
                                 super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                                 )._M_h._M_rehash_policy,
                         (collection->
                         super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                         )._M_h._M_bucket_count,
                         (collection->
                         super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                         )._M_h._M_element_count);
    __n = auVar14._8_8_;
    if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(collection->
               super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
               )._M_h._M_single_bucket;
        (collection->
        super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
        )._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (&local_49,__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var12._M_nxt =
           (collection->
           super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
           )._M_h._M_before_begin._M_nxt;
      (collection->
      super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
      )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var12._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(collection->
                  super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                  )._M_h._M_before_begin;
        uVar9 = 0;
        do {
          p_Var3 = (_Var12._M_nxt)->_M_nxt;
          uVar10 = (ulong)_Var12._M_nxt[4]._M_nxt % __n;
          if (__s[uVar10] == (_Hash_node_base *)0x0) {
            (_Var12._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var12._M_nxt;
            __s[uVar10] = p_Var1;
            if ((_Var12._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var7 = __s + uVar9;
              goto LAB_0057dc6b;
            }
          }
          else {
            (_Var12._M_nxt)->_M_nxt = __s[uVar10]->_M_nxt;
            pp_Var7 = &__s[uVar10]->_M_nxt;
            uVar10 = uVar9;
LAB_0057dc6b:
            *pp_Var7 = _Var12._M_nxt;
          }
          _Var12._M_nxt = p_Var3;
          uVar9 = uVar10;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var4 = (collection->
                super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                )._M_h._M_buckets;
      if (&(collection->
           super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
           )._M_h._M_single_bucket != pp_Var4) {
        operator_delete(pp_Var4,(collection->
                                super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                                )._M_h._M_bucket_count << 3);
      }
      (collection->
      super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
      )._M_h._M_bucket_count = __n;
      (collection->
      super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
      )._M_h._M_buckets = __s;
      uVar9 = (ulong)p_Var13 % __n;
    }
    p_Var6[4]._M_nxt = p_Var13;
    pp_Var4 = (collection->
              super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
              )._M_h._M_buckets;
    if (pp_Var4[uVar9] == (__node_base_ptr)0x0) {
      p_Var13 = (collection->
                super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                )._M_h._M_before_begin._M_nxt;
      p_Var6->_M_nxt = p_Var13;
      (collection->
      super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
      )._M_h._M_before_begin._M_nxt = p_Var6;
      if (p_Var13 != (_Hash_node_base *)0x0) {
        pp_Var4[(ulong)p_Var13[4]._M_nxt %
                (collection->
                super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                )._M_h._M_bucket_count] = p_Var6;
      }
      p_Var5 = (__node_ptr)
               (collection->
               super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
               )._M_h._M_buckets;
      (&p_Var5->super__Hash_node_base)[uVar9]._M_nxt =
           &(collection->
            super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
            )._M_h._M_before_begin;
    }
    else {
      p_Var6->_M_nxt = pp_Var4[uVar9]->_M_nxt;
      p_Var5 = (__node_ptr)pp_Var4[uVar9];
      (p_Var5->super__Hash_node_base)._M_nxt = p_Var6;
    }
    psVar2 = &(collection->
              super_unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
              )._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
  }
  return SUB81(p_Var5,0);
}

Assistant:

bool InsertIfNotPresent(
    Collection* const collection,
    const typename Collection::value_type::first_type& key,
    const typename Collection::value_type::second_type& value) {
  return InsertIfNotPresent(
      collection, typename Collection::value_type(key, value));
}